

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SmallVector<spirv_cross::SpecializationConstant,_8UL> * __thiscall
spirv_cross::Compiler::get_specialization_constants
          (SmallVector<spirv_cross::SpecializationConstant,_8UL> *__return_storage_ptr__,
          Compiler *this)

{
  ParsedIR *this_00;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRConstant *pSVar4;
  long lVar5;
  LoopLock local_40;
  SpecializationConstant local_38;
  
  (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::SpecializationConstant>).ptr =
       (SpecializationConstant *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  this_00 = &this->ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->ir).ids_for_type[3].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
           .ptr;
  sVar2 = (this->ir).ids_for_type[3].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar5);
    if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeConstant) {
      pSVar4 = ParsedIR::get<spirv_cross::SPIRConstant>(this_00,id);
      if (pSVar4->specialization == true) {
        bVar3 = ParsedIR::has_decoration
                          (this_00,(ID)(pSVar4->super_IVariant).self.id,DecorationSpecId);
        if (bVar3) {
          local_38.id.id = (pSVar4->super_IVariant).self.id;
          local_38.constant_id = ParsedIR::get_decoration(this_00,local_38.id.id,DecorationSpecId);
          SmallVector<spirv_cross::SpecializationConstant,_8UL>::push_back
                    (__return_storage_ptr__,&local_38);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<SpecializationConstant> Compiler::get_specialization_constants() const
{
	SmallVector<SpecializationConstant> spec_consts;
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, const SPIRConstant &c) {
		if (c.specialization && has_decoration(c.self, DecorationSpecId))
			spec_consts.push_back({ c.self, get_decoration(c.self, DecorationSpecId) });
	});
	return spec_consts;
}